

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

SC_Cell * Abc_SclFindSmallestGate(SC_Cell *p,float CinMin)

{
  bool bVar1;
  float fVar2;
  int local_2c;
  SC_Cell *pSStack_28;
  int i;
  SC_Cell *pRes;
  float CinMin_local;
  SC_Cell *p_local;
  
  local_2c = 0;
  pSStack_28 = p->pRepr;
  while( true ) {
    bVar1 = true;
    if (local_2c != 0) {
      bVar1 = pSStack_28 != p->pRepr;
    }
    if (!bVar1) break;
    fVar2 = SC_CellPinCapAve(pSStack_28);
    if (CinMin < fVar2) {
      return pSStack_28;
    }
    pSStack_28 = pSStack_28->pNext;
    local_2c = local_2c + 1;
  }
  return p->pRepr->pPrev;
}

Assistant:

SC_Cell * Abc_SclFindSmallestGate( SC_Cell * p, float CinMin )
{
    SC_Cell * pRes = NULL;
    int i;
    SC_RingForEachCell( p->pRepr, pRes, i )
        if ( SC_CellPinCapAve(pRes) > CinMin )
            return pRes;
    // take the largest gate
    return p->pRepr->pPrev;
}